

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

bool __thiscall
libtorrent::torrent_info::resolve_duplicate_filenames_slow
          (torrent_info *this,int max_duplicate_filenames,error_code *ec)

{
  anon_class_24_3_667ee5ce_for__M_pred __pred;
  bool bVar1;
  uchar byte;
  bool bVar2;
  file_flags_t lhs;
  int v;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  uint32_t uVar3;
  uint uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar5;
  unsigned_long uVar6;
  ulong uVar7;
  string *this_01;
  reference pcVar8;
  pointer ppVar9;
  int64_t iVar10;
  int64_t iVar11;
  undefined8 uVar12;
  char *in_RCX;
  char *pcVar13;
  undefined1 auVar14 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>_>
  pVar15;
  string_view str;
  string_view str_00;
  name_entry local_32c;
  pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry> local_324;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_318;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_310;
  value_type local_304;
  undefined1 auStack_300 [4];
  uint32_t new_hash;
  undefined8 local_2f8;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> local_2ec;
  undefined1 local_2e8 [4];
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc_1;
  char local_2c8 [8];
  char new_ext [50];
  int cnt;
  string ext;
  string base;
  string local_248;
  file_index_t local_224;
  undefined1 local_220 [8];
  string filename;
  bitfield_flag local_1ea;
  uchar local_1e9;
  int local_1e8;
  uchar local_1e2;
  bitfield_flag local_1e1;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_1e0;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_1dc;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  _Stack_1d8;
  file_index_t other_idx;
  name_entry local_1cc;
  pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry> local_1c4;
  torrent_info *local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_1b0;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *local_1a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_1a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_198;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_190;
  _Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>
  match;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>_>
  range;
  string local_170;
  file_index_t local_14c;
  uint32_t local_148;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_144;
  uint32_t hash;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_134
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end1;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin1;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range1;
  int num_collisions;
  name_entry local_110;
  value_type local_108;
  pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry> local_104;
  _Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
  local_f8;
  name_entry local_ec;
  value_type local_e4;
  pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry> local_e0;
  char local_d1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_d0;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__range3;
  int count;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> local_crc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *pcStack_88;
  file_index_t path_index;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> local_78 [2];
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths;
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  files;
  error_code *ec_local;
  int max_duplicate_filenames_local;
  torrent_info *this_local;
  
  files._M_h._M_single_bucket = (__node_base_ptr)ec;
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::unordered_multimap
            ((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
              *)&paths);
  this_00 = &file_storage::paths_abi_cxx11_(&this->m_files)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  sVar5 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00);
  v = file_storage::num_files(&this->m_files);
  uVar6 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(v);
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::reserve((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
             *)&paths,sVar5 + uVar6);
  boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::crc_optimal
            (local_78,0xffffffff);
  file_storage::name_abi_cxx11_(&this->m_files);
  uVar7 = ::std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    this_01 = file_storage::name_abi_cxx11_(&this->m_files);
    auVar14 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    str._M_len = auVar14._8_8_;
    pcStack_88 = auVar14._0_8_;
    str._M_str = in_RCX;
    (anonymous_namespace)::
    process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
              ((_anonymous_namespace_ *)local_78,pcStack_88,str);
  }
  __range2._4_4_ = -1;
  __end2 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&path), bVar1) {
    _count = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    __range3._4_4_ = local_78[0].rem_;
    uVar7 = ::std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::process_byte
                ((crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                 ((long)&__range3 + 4),'/');
    }
    __range3._0_4_ = 0;
    __end3._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_d0._M_current = (char *)::std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff30), bVar1) {
      pcVar8 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end3);
      local_d1 = *pcVar8;
      if (local_d1 == '/') {
        local_e4 = boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::
                   checksum((crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                            ((long)&__range3 + 4));
        local_ec.idx.m_val = __range2._4_4_;
        local_ec.length = (int)__range3;
        ::std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>::
        pair<unsigned_int,_true>(&local_e0,&local_e4,&local_ec);
        local_f8._M_cur =
             (__node_type *)
             ::std::
             unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
             ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                       *)&paths,&local_e0);
      }
      byte = libtorrent::aux::to_lower(local_d1);
      boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::process_byte
                ((crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                 ((long)&__range3 + 4),byte);
      __range3._0_4_ = (int)__range3 + 1;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    local_108 = boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::checksum
                          ((crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                           ((long)&__range3 + 4));
    local_110.idx.m_val = __range2._4_4_;
    local_110.length = ::std::__cxx11::string::size();
    ::std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>::
    pair<unsigned_int,_true>(&local_104,&local_108,&local_110);
    ::std::
    unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
    ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
              *)&paths,&local_104);
    libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator--
              ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)((long)&__range2 + 4));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  __range1._4_4_ = 0;
  ___end1 = file_storage::file_range(&this->m_files);
  local_134 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                       *)&__end1);
  rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
        end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
             *)&__end1);
  while( true ) {
    i = local_134.m_idx.m_val;
    hash = (uint32_t)rhs;
    bVar1 = libtorrent::operator!=(local_134,rhs);
    if (!bVar1) break;
    local_14c.m_val =
         (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              ::operator*(&local_134);
    local_144 = (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_14c.m_val;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",
               (allocator<char> *)
               ((long)&range.second.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                       ._M_cur + 7));
    uVar3 = file_storage::file_path_hash(&this->m_files,local_14c,&local_170);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&range.second.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                       ._M_cur + 7));
    local_148 = uVar3;
    pVar15 = ::std::
             unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
             ::equal_range((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                            *)&paths,&local_148);
    local_1a0._M_cur =
         (__node_type *)
         pVar15.second.
         super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
         ._M_cur;
    local_198._M_cur =
         (__node_type *)
         pVar15.first.
         super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
         ._M_cur;
    local_1a8 = &local_144;
    __pred.paths = this_00;
    __pred.this = this;
    __pred.i = local_1a8;
    local_1b8 = this;
    pvStack_1b0 = this_00;
    match.
    super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
               )(_Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                 )local_198._M_cur;
    range.first.
    super__Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
               )(_Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                 )local_1a0._M_cur;
    local_190._M_cur =
         (__node_type *)
         ::std::
         find_if<std::__detail::_Node_iterator<std::pair<unsigned_int_const,libtorrent::(anonymous_namespace)::name_entry>,false,false>,libtorrent::torrent_info::resolve_duplicate_filenames_slow(int,boost::system::error_code&)::__0>
                   ((_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>
                     )local_198._M_cur,
                    (_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>
                     )local_1a0._M_cur,__pred);
    bVar1 = ::std::__detail::operator==
                      (&local_190,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false>
                        *)&range);
    if (bVar1) {
      local_1cc.idx.m_val = local_144.m_val;
      local_1cc.length = 0;
      ::std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>::
      pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_true>
                (&local_1c4,&local_148,&local_1cc);
      _Stack_1d8._M_cur =
           (__node_type *)
           ::std::
           unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
           ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                     *)&paths,&local_1c4);
    }
    else {
      ppVar9 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_false,_false>
                             *)&local_190);
      local_1dc.m_val = (ppVar9->second).idx.m_val;
      local_1e0.m_val = 0;
      bVar2 = libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::
              operator>=(&local_1dc,&local_1e0);
      bVar1 = false;
      if (bVar2) {
        local_1e8 = local_144.m_val;
        local_1e2 = (uchar)file_storage::file_flags(&this->m_files,(file_index_t)local_144.m_val);
        local_1e9 = '\x01';
        local_1e1 = (bitfield_flag)
                    libtorrent::flags::operator&
                              ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                               local_1e2,
                               (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                               '\x01');
        bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1e1);
        bVar1 = false;
        if (bVar2) {
          lhs = file_storage::file_flags(&this->m_files,(file_index_t)local_1dc.m_val);
          local_1ea = (bitfield_flag)
                      libtorrent::flags::operator&
                                ((bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                 lhs.m_val,
                                 (bitfield_flag<unsigned_char,_libtorrent::file_flags_tag,_void>)
                                 '\x01');
          bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_1ea);
          bVar1 = false;
          if (bVar2) {
            iVar10 = file_storage::file_size(&this->m_files,(file_index_t)local_144.m_val);
            filename.field_2._12_4_ = local_1dc.m_val;
            iVar11 = file_storage::file_size(&this->m_files,(file_index_t)local_1dc.m_val);
            bVar1 = iVar10 == iVar11;
          }
        }
      }
      if (!bVar1) {
        local_224.m_val = local_144.m_val;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_248,"",(allocator<char> *)(base.field_2._M_local_buf + 0xf));
        file_storage::file_path((string *)local_220,&this->m_files,local_224,&local_248);
        ::std::__cxx11::string::~string((string *)&local_248);
        ::std::allocator<char>::~allocator((allocator<char> *)(base.field_2._M_local_buf + 0xf));
        remove_extension((string *)((long)&ext.field_2 + 8),(string *)local_220);
        extension((string *)(new_ext + 0x30),(string *)local_220);
        new_ext[0x2c] = '\0';
        new_ext[0x2d] = '\0';
        new_ext[0x2e] = '\0';
        new_ext[0x2f] = '\0';
        do {
          uVar4 = new_ext._44_4_ + 1;
          new_ext._44_4_ = uVar4;
          uVar12 = ::std::__cxx11::string::c_str();
          pcVar13 = (char *)(ulong)uVar4;
          snprintf(local_2c8,0x32,".%d%s",pcVar13,uVar12);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&ext.field_2 + 8),local_2c8);
          ::std::__cxx11::string::operator=((string *)local_220,(string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::crc_optimal
                    (&local_2ec,0xffffffff);
          auVar14 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_220);
          str_00._M_len = auVar14._8_8_;
          str_00._M_str = pcVar13;
          _auStack_300 = auVar14;
          (anonymous_namespace)::
          process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
                    ((_anonymous_namespace_ *)&local_2ec,auVar14._0_8_,str_00);
          local_304 = boost::crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true>::
                      checksum(&local_2ec);
          local_310._M_cur =
               (__node_type *)
               ::std::
               unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
               ::find((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                       *)&paths,&local_304);
          local_318._M_cur =
               (__node_type *)
               ::std::
               unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
               ::end((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                      *)&paths);
          bVar1 = ::std::__detail::operator==(&local_310,&local_318);
          if (bVar1) {
            local_32c.idx.m_val = local_144.m_val;
            local_32c.length = 0;
            ::std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>::
            pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_true>
                      (&local_324,&local_304,&local_32c);
            ::std::
            unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
            ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                      *)&paths,&local_324);
            copy_on_write(this);
            file_storage::rename_file
                      (&this->m_files,(file_index_t)local_144.m_val,(string *)local_220);
            bVar1 = false;
            goto LAB_00736148;
          }
          __range1._4_4_ = __range1._4_4_ + 1;
        } while (__range1._4_4_ <= max_duplicate_filenames);
        boost::system::error_code::operator=
                  ((error_code *)files._M_h._M_single_bucket,too_many_duplicate_filenames);
        file_storage::set_piece_length(&this->m_files,0);
        this_local._7_1_ = 0;
        bVar1 = true;
LAB_00736148:
        ::std::__cxx11::string::~string((string *)(new_ext + 0x30));
        ::std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)local_220);
        if (bVar1) goto LAB_007361c7;
      }
    }
    index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
    operator++(&local_134);
  }
  this_local._7_1_ = 1;
LAB_007361c7:
  ::std::
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  ::~unordered_multimap
            ((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
              *)&paths);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool torrent_info::resolve_duplicate_filenames_slow(
		int const max_duplicate_filenames, error_code& ec)
	{
		INVARIANT_CHECK;

		// maps filename hash to file index
		// or, if the file_index is negative, maps into the paths vector
		std::unordered_multimap<std::uint32_t, name_entry> files;

		std::vector<std::string> const& paths = m_files.paths();
		files.reserve(paths.size() + aux::numeric_cast<std::size_t>(m_files.num_files()));

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		{
			boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
			if (!m_files.name().empty())
			{
				process_string_lowercase(crc, m_files.name());
			}
			file_index_t path_index{-1};
			for (auto const& path : paths)
			{
				auto local_crc = crc;
				if (!path.empty()) local_crc.process_byte(TORRENT_SEPARATOR);
				int count = 0;
				for (char const c : path)
				{
					if (c == TORRENT_SEPARATOR)
						files.insert({local_crc.checksum(), {path_index, count}});
					local_crc.process_byte(aux::to_lower(c) & 0xff);
					++count;
				}
				files.insert({local_crc.checksum(), {path_index, int(path.size())}});
				--path_index;
			}
		}

		// keep track of the total number of name collisions. If there are too
		// many, it's probably a malicious torrent and we should just fail
		int num_collisions = 0;
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const hash = m_files.file_path_hash(i, "");
			auto range = files.equal_range(hash);
			auto const match = std::find_if(range.first, range.second, [&](std::pair<std::uint32_t, name_entry> const& o)
			{
				std::string const other_name = o.second.idx < file_index_t{}
					? combine_path(m_files.name(), paths[std::size_t(-static_cast<int>(o.second.idx)-1)].substr(0, std::size_t(o.second.length)))
					: m_files.file_path(o.second.idx);
				return aux::string_equal_no_case(other_name, m_files.file_path(i));
			});

			if (match == range.second)
			{
				files.insert({hash, {i, 0}});
				continue;
			}

			// pad files are allowed to collide with each-other, as long as they have
			// the same size.
			file_index_t const other_idx = match->second.idx;
			if (other_idx >= file_index_t{}
				&& (m_files.file_flags(i) & file_storage::flag_pad_file)
				&& (m_files.file_flags(other_idx) & file_storage::flag_pad_file)
				&& m_files.file_size(i) == m_files.file_size(other_idx))
				continue;

			std::string filename = m_files.file_path(i);
			std::string base = remove_extension(filename);
			std::string ext = extension(filename);
			int cnt = 0;
			for (;;)
			{
				++cnt;
				char new_ext[50];
				std::snprintf(new_ext, sizeof(new_ext), ".%d%s", cnt, ext.c_str());
				filename = base + new_ext;

				boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
				process_string_lowercase(crc, filename);
				std::uint32_t const new_hash = crc.checksum();
				if (files.find(new_hash) == files.end())
				{
					files.insert({new_hash, {i, 0}});
					break;
				}
				++num_collisions;
				if (num_collisions > max_duplicate_filenames)
				{
					ec = errors::too_many_duplicate_filenames;
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}
			}

			copy_on_write();
			m_files.rename_file(i, filename);
		}
		return true;
	}